

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O2

ClosestPointData * __thiscall
CMeshClosestPointMapper::SamplePoint::ClosestPoint(SamplePoint *this,int fi)

{
  vector<CMeshClosestPointMapper::ClosestPointData,_std::allocator<CMeshClosestPointMapper::ClosestPointData>_>
  *this_00;
  ClosestPointData *pCVar1;
  ClosestPointData *pCVar2;
  pointer pCVar3;
  ClosestPointData *pCVar4;
  long lVar5;
  
  this_00 = &this->m_closestMeshPts;
  pCVar3 = (this->m_closestMeshPts).
           super__Vector_base<CMeshClosestPointMapper::ClosestPointData,_std::allocator<CMeshClosestPointMapper::ClosestPointData>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(this->m_closestMeshPts).
                    super__Vector_base<CMeshClosestPointMapper::ClosestPointData,_std::allocator<CMeshClosestPointMapper::ClosestPointData>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pCVar3) < 0x780) {
    std::
    vector<CMeshClosestPointMapper::ClosestPointData,_std::allocator<CMeshClosestPointMapper::ClosestPointData>_>
    ::reserve(this_00,0x1e);
    pCVar3 = (this_00->
             super__Vector_base<CMeshClosestPointMapper::ClosestPointData,_std::allocator<CMeshClosestPointMapper::ClosestPointData>_>
             )._M_impl.super__Vector_impl_data._M_start;
  }
  lVar5 = ((long)(this->m_closestMeshPts).
                 super__Vector_base<CMeshClosestPointMapper::ClosestPointData,_std::allocator<CMeshClosestPointMapper::ClosestPointData>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar3 >> 6) + 1;
  pCVar4 = pCVar3 + -1;
  do {
    lVar5 = lVar5 + -1;
    if (lVar5 == 0) {
      std::
      vector<CMeshClosestPointMapper::ClosestPointData,_std::allocator<CMeshClosestPointMapper::ClosestPointData>_>
      ::emplace_back<>(this_00);
      pCVar3 = (this->m_closestMeshPts).
               super__Vector_base<CMeshClosestPointMapper::ClosestPointData,_std::allocator<CMeshClosestPointMapper::ClosestPointData>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      ClosestPtToMeshFace(this->m_mesh,fi,&this->m_pt,&pCVar3[-1].m_P,&pCVar3[-1].m_t);
      pCVar3[-1].m_fi = fi;
      return pCVar3 + -1;
    }
    pCVar1 = pCVar4 + 1;
    pCVar2 = pCVar4 + 1;
    pCVar4 = pCVar1;
  } while (pCVar2->m_fi != fi);
  return pCVar1;
}

Assistant:

const ClosestPointData& ClosestPoint(int fi)
    {
      if (m_closestMeshPts.capacity() < 30)
      {
        m_closestMeshPts.reserve(30);
      }
      for (int i = 0; i < m_closestMeshPts.size(); i++)
      {
        if (m_closestMeshPts[i].m_fi == fi)
        {
          return m_closestMeshPts[i];
        }
      }
      m_closestMeshPts.emplace_back();
      ClosestPointData& q = m_closestMeshPts.back();
      ::ClosestPtToMeshFace(&m_mesh, fi, m_pt, q.m_P, q.m_t);
      q.m_fi = fi;
      return q;
    }